

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

Node * prvTidyInsertedToken(TidyDocImpl *doc)

{
  Lexer *lexer_00;
  IStack *pIVar1;
  uint uVar2;
  tmbstr ptVar3;
  AttVal *pAVar4;
  uint n;
  IStack *istack;
  Node *node;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  if (lexer_00->insert == (IStack *)0x0) {
    doc_local = (TidyDocImpl *)lexer_00->inode;
    lexer_00->inode = (Node *)0x0;
  }
  else {
    if (lexer_00->inode == (Node *)0x0) {
      lexer_00->lines = doc->docIn->curline;
      lexer_00->columns = doc->docIn->curcol;
    }
    doc_local = (TidyDocImpl *)prvTidyNewNode(doc->allocator,lexer_00);
    (doc_local->root).type = StartTag;
    (doc_local->root).implicit = yes;
    (doc_local->root).start = lexer_00->txtstart;
    (doc_local->root).end = lexer_00->txtend;
    pIVar1 = lexer_00->insert;
    ptVar3 = prvTidytmbstrdup(doc->allocator,pIVar1->element);
    (doc_local->root).element = ptVar3;
    (doc_local->root).tag = pIVar1->tag;
    pAVar4 = prvTidyDupAttrs(doc,pIVar1->attributes);
    (doc_local->root).attributes = pAVar4;
    uVar2 = (int)((long)lexer_00->insert - (long)lexer_00->istack >> 5) + 1;
    if (uVar2 < lexer_00->istacksize) {
      lexer_00->insert = lexer_00->istack + uVar2;
    }
    else {
      lexer_00->insert = (IStack *)0x0;
    }
  }
  return &doc_local->root;
}

Assistant:

Node *TY_(InsertedToken)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    IStack *istack;
    uint n;

    /* this will only be NULL if inode != NULL */
    if (lexer->insert == NULL)
    {
        node = lexer->inode;
        lexer->inode = NULL;
        return node;
    }

    /*
      If this is the "latest" node then update
      the position, otherwise use current values
    */

    if (lexer->inode == NULL)
    {
        lexer->lines = doc->docIn->curline;
        lexer->columns = doc->docIn->curcol;
    }

    node = TY_(NewNode)(doc->allocator, lexer);
    node->type = StartTag;
    node->implicit = yes;
    node->start = lexer->txtstart;
    /* #431734 [JTidy bug #226261 (was 126261)] - fix by Gary Peskin 20 Dec 00 */ 
    node->end = lexer->txtend; /* was : lexer->txtstart; */
    istack = lexer->insert;

/* #if 0 && defined(_DEBUG) */
#if definedENABLE_DEBUG_LOG
    if ( lexer->istacksize == 0 )
    {
        SPRTF( "WARNING: ZERO sized istack!\n" );
    }
#endif

    node->element = TY_(tmbstrdup)(doc->allocator, istack->element);
    node->tag = istack->tag;
    node->attributes = TY_(DupAttrs)( doc, istack->attributes );

    /* advance lexer to next item on the stack */
    n = (uint)(lexer->insert - &(lexer->istack[0]));

    /* and recover state if we have reached the end */
    if (++n < lexer->istacksize)
        lexer->insert = &(lexer->istack[n]);
    else
        lexer->insert = NULL;

    return node;
}